

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dwarf.hpp
# Opt level: O0

Dwarf_Half __thiscall cpptrace::detail::libdwarf::die_object::get_tag(die_object *this)

{
  source_location location;
  int iVar1;
  byte bVar2;
  undefined7 in_stack_ffffffffffffffc8;
  char *in_stack_ffffffffffffffd0;
  unsigned_short *local_20;
  unsigned_short local_12;
  die_object *pdStack_10;
  Dwarf_Half tag;
  die_object *this_local;
  
  local_12 = 0;
  local_20 = &local_12;
  pdStack_10 = this;
  iVar1 = wrap<Dwarf_Die_s_*,_unsigned_short_*,_Dwarf_Error_s_**,_Dwarf_Die_s_*const_&,_unsigned_short_*,_0>
                    (this,dwarf_tag,&this->die,&local_20);
  bVar2 = iVar1 == 0;
  source_location::source_location
            ((source_location *)&stack0xffffffffffffffd0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/gnilk[P]testrunner/build_O0/_deps/cpptrace-src/src/symbols/dwarf/dwarf.hpp"
             ,0xb4);
  location.file._7_1_ = bVar2;
  location.file._0_7_ = in_stack_ffffffffffffffc8;
  location._8_8_ = in_stack_ffffffffffffffd0;
  assert_impl<bool>((detail *)(ulong)(bVar2 & 1),true,0x33e637,
                    "Dwarf_Half cpptrace::detail::libdwarf::die_object::get_tag() const",
                    in_stack_ffffffffffffffd0,location);
  return local_12;
}

Assistant:

Dwarf_Half get_tag() const {
            Dwarf_Half tag = 0;
            VERIFY(wrap(dwarf_tag, die, &tag) == DW_DLV_OK);
            return tag;
        }